

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O0

void __thiscall Liby::EventQueue::EventQueue(EventQueue *this,Poller *poller)

{
  int iVar1;
  Logger *pLVar2;
  int *piVar3;
  pointer this_00;
  double __x;
  double __x_00;
  unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_> local_48;
  unique_ptr<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_> local_40 [3];
  initializer_list<std::function<void_()>_> local_28;
  Poller *local_18;
  Poller *poller_local;
  EventQueue *this_local;
  
  this->poller_ = poller;
  this->eventfd_ = -1;
  local_18 = poller;
  poller_local = (Poller *)this;
  std::unique_ptr<Liby::FileDescriptor,std::default_delete<Liby::FileDescriptor>>::
  unique_ptr<std::default_delete<Liby::FileDescriptor>,void>
            ((unique_ptr<Liby::FileDescriptor,std::default_delete<Liby::FileDescriptor>> *)
             &this->eventfp_);
  std::unique_ptr<Liby::Channel,std::default_delete<Liby::Channel>>::
  unique_ptr<std::default_delete<Liby::Channel>,void>
            ((unique_ptr<Liby::Channel,std::default_delete<Liby::Channel>> *)&this->eventChanelPtr_)
  ;
  std::initializer_list<std::function<void_()>_>::initializer_list(&local_28);
  BlockingQueue<std::function<void_()>_>::BlockingQueue(&this->eventHandlers_,local_28);
  if (this->poller_ == (Poller *)0x0) {
    pLVar2 = Logger::getLogger();
    Logger::log(pLVar2,__x);
    exit(1);
  }
  iVar1 = eventfd(1000,0x80800);
  this->eventfd_ = iVar1;
  if (this->eventfd_ < 0) {
    pLVar2 = Logger::getLogger();
    piVar3 = __errno_location();
    strerror(*piVar3);
    Logger::log(pLVar2,__x_00);
    exit(1);
  }
  std::make_unique<Liby::FileDescriptor,int&>((int *)local_40);
  std::unique_ptr<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>::operator=
            (&this->eventfp_,local_40);
  std::unique_ptr<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>::~unique_ptr
            (local_40);
  this_00 = std::unique_ptr<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>::
            operator->(&this->eventfp_);
  FileDescriptor::set_noblock(this_00,true);
  std::make_unique<Liby::Channel,Liby::Poller*&,int&>((Poller **)&local_48,(int *)this);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator=
            (&this->eventChanelPtr_,&local_48);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr(&local_48);
  return;
}

Assistant:

EventQueue::EventQueue(Poller *poller) : poller_(poller) {
    fatalif(poller_ == nullptr, "Poller cannot be nullptr");
#ifdef __linux__
    eventfd_ = ::eventfd(1000, EFD_CLOEXEC | EFD_NONBLOCK);
    fatalif(eventfd_ < 0, "eventfd create: %s", ::strerror(errno));
    eventfp_ = std::make_unique<FileDescriptor>(eventfd_);
    eventfp_->set_noblock();
#elif defined(__APPLE__)
    int fds[2];
    if (::pipe(fds) < 0)
        fatal("pipe: %s", ::strerror(errno));
    eventfd_ = fds[0];
    event2fd_ = fds[1];
    eventfp_ = std::make_unique<FileDescriptor>(eventfd_);
    event2fp_ = std::make_unique<FileDescriptor>(event2fd_);
    eventfp_->set_noblock();
    event2fp_->set_noblock();
#endif
    eventChanelPtr_ = std::make_unique<Channel>(poller_, eventfd_);
}